

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

FTextureID __thiscall FTextureManager::AddTexture(FTextureManager *this,FTexture *texture)

{
  uint uVar1;
  char *pcVar2;
  FTextureID local_40;
  uint local_3c;
  undefined1 auStack_38 [4];
  int trans;
  TextureHash hasher;
  int hash;
  int bucket;
  FTexture *texture_local;
  FTextureManager *this_local;
  
  if (texture == (FTexture *)0x0) {
    FTextureID::FTextureID((FTextureID *)((long)&this_local + 4),-1);
  }
  else {
    pcVar2 = FString::operator[](&texture->Name,0);
    if (*pcVar2 == '\0') {
      hasher._12_4_ = 0xffffffff;
      hasher.HashNext = -1;
    }
    else {
      pcVar2 = FString::operator_cast_to_char_(&texture->Name);
      uVar1 = MakeKey(pcVar2);
      hasher._12_4_ = uVar1 % 0x403;
      hasher.HashNext = this->HashFirst[(int)hasher._12_4_];
    }
    hasher.Texture._0_4_ = hasher.HashNext;
    _auStack_38 = texture;
    local_3c = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Push
                         (&this->Textures,(TextureHash *)auStack_38);
    TArray<int,_int>::Push(&this->Translation,(int *)&local_3c);
    if (-1 < (int)hasher._12_4_) {
      this->HashFirst[(int)hasher._12_4_] = local_3c;
    }
    FTextureID::FTextureID(&local_40,local_3c);
    (texture->id).texnum = local_40.texnum;
    this_local._4_4_ = (texture->id).texnum;
  }
  return (FTextureID)this_local._4_4_;
}

Assistant:

FTextureID FTextureManager::AddTexture (FTexture *texture)
{
	int bucket;
	int hash;

	if (texture == NULL) return FTextureID(-1);

	// Later textures take precedence over earlier ones

	// Textures without name can't be looked for
	if (texture->Name[0] != '\0')
	{
		bucket = int(MakeKey (texture->Name) % HASH_SIZE);
		hash = HashFirst[bucket];
	}
	else
	{
		bucket = -1;
		hash = -1;
	}

	TextureHash hasher = { texture, hash };
	int trans = Textures.Push (hasher);
	Translation.Push (trans);
	if (bucket >= 0) HashFirst[bucket] = trans;
	return (texture->id = FTextureID(trans));
}